

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

int Session_destroy(Session_t *handle)

{
  ostream *poVar1;
  ShPtrRep *rep_00;
  ShPtr<HG::SessionImpl> local_28;
  ShPtr<HG::SessionImpl> shptr;
  ShPtrRep *rep;
  Session_t *handle_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Calling destroy for session @");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,handle);
  std::operator<<(poVar1,'\n');
  rep_00 = HgHandles::repr<Session_t>(handle);
  ShPtr<HG::SessionImpl>::ShPtr(&local_28,rep_00);
  ShPtr<HG::SessionImpl>::~ShPtr(&local_28);
  return 0;
}

Assistant:

int Session_destroy(Session_t *handle) {
    std::cout << "Calling destroy for session @" << handle << '\n';
    auto rep = HgHandles::repr(handle, HgHandles::RefCount());
    ShPtr<HG::SessionImpl> shptr(rep);
    return 0;
}